

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<float> *this;
  char *__s;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  float *p;
  reference pvVar4;
  ostream *poVar5;
  reference __t;
  reference pvVar6;
  rep rVar7;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  reference_wrapper<const_std::vector<float,_std::allocator<float>_>_> local_150;
  thread local_148;
  int local_13c;
  int nworkload;
  lock_guard<std::mutex> iolock;
  int cpu_num;
  undefined1 local_120 [8];
  string workload_name;
  WorkloadFunc func;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_d8;
  int i_1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0;
  duration<double,_std::ratio<1L,_1000L>_> local_c8;
  vector<float,_std::allocator<float>_> local_c0;
  int local_a8;
  allocator<std::vector<float,_std::allocator<float>_>_> local_a1;
  int i;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  inputs;
  time_point t1;
  size_t INPUT_SIZE;
  undefined1 local_70 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_50 [8];
  vector<float,_std::allocator<float>_> results;
  int num_workloads;
  locale local_28 [8];
  locale local_20 [8];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  std::locale::locale(local_28,"");
  std::ios::imbue(local_20);
  std::locale::~locale(local_20);
  std::locale::~locale(local_28);
  results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (int)argv_local / 2;
  sVar3 = (size_type)
          (int)results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  this = (allocator<float> *)
         ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(this);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_50,sVar3,this);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  p = std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)local_50);
  do_not_optimize(p);
  sVar3 = (size_type)
          (int)results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)((long)&INPUT_SIZE + 7));
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70,sVar3,
             (allocator<std::thread> *)((long)&INPUT_SIZE + 7));
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)((long)&INPUT_SIZE + 7));
  inputs.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::_V2::system_clock::now();
  iVar2 = (int)results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 1;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(&local_a1);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&i,(long)iVar2,&local_a1);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator(&local_a1);
  for (local_a8 = 0;
      local_a8 <
      (int)results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage; local_a8 = local_a8 + 1) {
    make_input_array(&local_c0,100000000);
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)&i,(long)local_a8);
    std::vector<float,_std::allocator<float>_>::operator=(pvVar4,&local_c0);
    std::vector<float,_std::allocator<float>_>::~vector(&local_c0);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Created ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(int)results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
  poVar5 = std::operator<<(poVar5," input arrays");
  poVar5 = std::operator<<(poVar5,"; elapsed: ");
  tStack_d8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_d0.__r = (rep_conflict)
                 std::chrono::operator-
                           (&stack0xffffffffffffff28,
                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&inputs.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_c8,&local_d0);
  rVar7 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_c8);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar7);
  std::operator<<(poVar5," ms\n");
  for (func._M_invoker._4_4_ = 1; func._M_invoker._4_4_ < (int)argv_local;
      func._M_invoker._4_4_ = func._M_invoker._4_4_ + 2) {
    std::function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)>::function
              ((function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)> *)
               ((long)&workload_name.field_2 + 8));
    __s = local_18[func._M_invoker._4_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,__s,(allocator<char> *)((long)&cpu_num + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&cpu_num + 3));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120,"fpchurn");
    if (bVar1) {
      std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                 (workload_name.field_2._M_local_buf + 8),workload_fpchurn);
LAB_00103ebc:
      if (func._M_invoker._4_4_ + 1 < (int)argv_local) {
        iolock._M_device._4_4_ = atoi(local_18[func._M_invoker._4_4_ + 1]);
      }
      else {
        iolock._M_device._4_4_ = 0;
      }
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&stack0xfffffffffffffec8,&iomutex);
      poVar5 = std::operator<<((ostream *)&std::cout,"Spawning workload \'");
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,"\' on CPU ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iolock._M_device._4_4_);
      std::operator<<(poVar5,"\n");
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xfffffffffffffec8);
      local_13c = func._M_invoker._4_4_ / 2;
      pvVar4 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             *)&i,(long)local_13c);
      local_150 = std::cref<std::vector<float,std::allocator<float>>>(pvVar4);
      __t = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_50,(long)local_13c);
      __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)std::ref<float>(__t);
      std::thread::
      thread<std::function<void(std::vector<float,std::allocator<float>>const&,float&)>&,std::reference_wrapper<std::vector<float,std::allocator<float>>const>,std::reference_wrapper<float>,void>
                (&local_148,
                 (function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)> *)
                 ((long)&workload_name.field_2 + 8),&local_150,(reference_wrapper<float> *)&__range1
                );
      pvVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_70,
                          (long)local_13c);
      std::thread::operator=(pvVar6,&local_148);
      std::thread::~thread(&local_148);
      pvVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_70,
                          (long)local_13c);
      pin_thread_to_cpu(pvVar6,iolock._M_device._4_4_);
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"sin");
      if (bVar1) {
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   (workload_name.field_2._M_local_buf + 8),workload_sin);
        goto LAB_00103ebc;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"accum");
      if (bVar1) {
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   (workload_name.field_2._M_local_buf + 8),workload_accum);
        goto LAB_00103ebc;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"unrollaccum4");
      if (bVar1) {
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   (workload_name.field_2._M_local_buf + 8),workload_unrollaccum4);
        goto LAB_00103ebc;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"unrollaccum8");
      if (bVar1) {
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   (workload_name.field_2._M_local_buf + 8),workload_unrollaccum8);
        goto LAB_00103ebc;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"stdaccum");
      if (bVar1) {
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   (workload_name.field_2._M_local_buf + 8),workload_stdaccum);
        goto LAB_00103ebc;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"unknown workload: ");
      poVar5 = std::operator<<(poVar5,local_18[func._M_invoker._4_4_]);
      std::operator<<(poVar5,"\n");
      argv_local._4_4_ = 1;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_120);
    std::function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)>::~function
              ((function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)> *)
               ((long)&workload_name.field_2 + 8));
    if (bVar1) goto LAB_00104178;
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  argv_local._4_4_ = 0;
LAB_00104178:
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&i);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_50);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv) {
  // Set locale for comma-separation in large numbers.
  std::cout.imbue(std::locale(""));

  // Command-line invocation:
  //
  //  argv[0] is the program name
  //  argv[1] is workload name, with cpu number at argv[2]
  //  argv[3] is workload name, with cpu number at argv[4]
  //  ... etc.

  int num_workloads = argc / 2;
  std::vector<float> results(num_workloads);
  do_not_optimize(results.data());
  std::vector<std::thread> threads(num_workloads);

  constexpr size_t INPUT_SIZE = 100 * 1000 * 1000;
  auto t1 = hires_clock::now();

  // Allocate and initialize one extra input array - not used by any workload.
  // This makes sure none of the actual working inputs stays in L3 cache (which
  // is fairly sizable), giving one of the workloads an unfair advantage. The
  // lower cache layers are so small compared to the input size that their
  // pre-seeding advantage is negligible.
  std::vector<std::vector<float>> inputs(num_workloads + 1);
  for (int i = 0; i < num_workloads; ++i) {
    inputs[i] = make_input_array(INPUT_SIZE);
  }
  std::cout << "Created " << num_workloads + 1 << " input arrays"
            << "; elapsed: " << duration_ms(hires_clock::now() - t1).count()
            << " ms\n";

  for (int i = 1; i < argc; i += 2) {
    WorkloadFunc func;
    std::string workload_name = argv[i];
    if (workload_name == "fpchurn") {
      func = workload_fpchurn;
    } else if (workload_name == "sin") {
      func = workload_sin;
    } else if (workload_name == "accum") {
      func = workload_accum;
    } else if (workload_name == "unrollaccum4") {
      func = workload_unrollaccum4;
    } else if (workload_name == "unrollaccum8") {
      func = workload_unrollaccum8;
    } else if (workload_name == "stdaccum") {
      func = workload_stdaccum;
    } else {
      std::cerr << "unknown workload: " << argv[i] << "\n";
      return 1;
    }

    int cpu_num;
    if (i + 1 >= argc) {
      cpu_num = 0;
    } else {
      cpu_num = std::atoi(argv[i + 1]);
    }

    {
      std::lock_guard<std::mutex> iolock(iomutex);
      std::cout << "Spawning workload '" << workload_name << "' on CPU "
                << cpu_num << "\n";
    }

    int nworkload = i / 2;
    threads[nworkload] = std::thread(func, std::cref(inputs[nworkload]),
                                     std::ref(results[nworkload]));
    pin_thread_to_cpu(threads[nworkload], cpu_num);
  }

  // All the threads were launched in parallel in the loop above. Now wait for
  // all of them to finish.
  for (auto& t : threads) {
    t.join();
  }
  return 0;
}